

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::SmallVectorBase<std::byte>::emplace_back<std::byte>
          (SmallVectorBase<std::byte> *this,byte *args)

{
  iterator pbVar1;
  byte *in_RSI;
  SmallVectorBase<std::byte> *in_RDI;
  byte *in_stack_00000020;
  pointer in_stack_00000028;
  SmallVectorBase<std::byte> *in_stack_00000030;
  pointer local_8;
  
  if (in_RDI->len == in_RDI->cap) {
    end(in_RDI);
    local_8 = emplaceRealloc<std::byte>(in_stack_00000030,in_stack_00000028,in_stack_00000020);
  }
  else {
    pbVar1 = end(in_RDI);
    *pbVar1 = *in_RSI;
    in_RDI->len = in_RDI->len + 1;
    local_8 = back(in_RDI);
  }
  return local_8;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }